

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O2

matrix __thiscall sptk::swipe::im2m(swipe *this,intmatrix yr_matrix)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  int ySz;
  ulong uVar4;
  matrix mVar5;
  
  ySz = (int)((ulong)this >> 0x20);
  mVar5 = makem((int)this,ySz);
  uVar1 = 0;
  uVar4 = (ulong)this >> 0x20;
  if (ySz == 0 || (long)this < 0) {
    uVar4 = uVar1;
  }
  uVar2 = 0;
  if (0 < (int)this) {
    uVar2 = (ulong)this & 0xffffffff;
  }
  for (; uVar1 != uVar2; uVar1 = uVar1 + 1) {
    for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      mVar5.m[uVar1][uVar3] = (double)*(int *)(*(long *)(yr_matrix._0_8_ + uVar1 * 8) + uVar3 * 4);
    }
  }
  return mVar5;
}

Assistant:

matrix im2m(intmatrix yr_matrix) {
    matrix nw_matrix = makem(yr_matrix.x, yr_matrix.y);
    int i, j;
    for (i = 0; i < yr_matrix.x; i++)
        for (j = 0; j < yr_matrix.y; j++)
            nw_matrix.m[i][j] = yr_matrix.m[i][j];
    return(nw_matrix);
}